

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

int Acb_NtkFindSupp1(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  lit lVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  lit *begin;
  ulong uVar12;
  char *__assertion;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  
  vSupp->nSize = 0;
  if (Pivot < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if ((p->vObjFans).nSize <= Pivot) goto LAB_003a4da9;
  iVar10 = (p->vObjFans).pArray[(uint)Pivot];
  lVar15 = (long)iVar10;
  if ((lVar15 < 0) || ((p->vFanSto).nSize <= iVar10)) goto LAB_003a4e2e;
  piVar6 = (p->vFanSto).pArray;
  if (piVar6[lVar15] < 1) {
    begin = vSupp->pArray;
    iVar10 = 0;
LAB_003a4ca3:
    lVar15 = (long)iVar10;
  }
  else {
    lVar16 = 0;
    do {
      lVar8 = lVar16 + 1;
      lVar16 = lVar16 + 1;
      Vec_IntPush(vSupp,piVar6[lVar15 + lVar8]);
    } while (lVar16 < piVar6[lVar15]);
    iVar10 = vSupp->nSize;
    begin = vSupp->pArray;
    if (1 < (long)iVar10) {
      uVar11 = 1;
      uVar12 = 0;
      do {
        uVar1 = uVar12 + 1;
        uVar14 = uVar12 & 0xffffffff;
        uVar13 = uVar11;
        do {
          iVar2 = begin[uVar13];
          if (((long)iVar2 < 0) || (uVar3 = (p->vFanouts).nSize, (int)uVar3 <= iVar2)) {
LAB_003a4d6b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          uVar4 = begin[(int)uVar14];
          if (((long)(int)uVar4 < 0) || (uVar3 <= uVar4)) goto LAB_003a4d6b;
          pVVar7 = (p->vFanouts).pArray;
          uVar9 = uVar13 & 0xffffffff;
          if (pVVar7[iVar2].nSize <= pVVar7[(int)uVar4].nSize) {
            uVar9 = uVar14;
          }
          uVar14 = uVar9;
          uVar13 = uVar13 + 1;
        } while ((long)iVar10 != uVar13);
        lVar5 = begin[uVar12];
        begin[uVar12] = begin[(int)uVar14];
        begin[(int)uVar14] = lVar5;
        uVar11 = uVar11 + 1;
        uVar12 = uVar1;
      } while (uVar1 != iVar10 - 1);
      iVar10 = vSupp->nSize;
    }
    if (iVar10 < 1) goto LAB_003a4ca3;
    lVar15 = 0;
    do {
      uVar3 = begin[lVar15];
      if ((long)(int)uVar3 < 1) {
        __assertion = "i>0";
LAB_003a4df7:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
      }
      uVar4 = (p->vObjFunc).nSize;
      if ((int)uVar4 < 1) {
        __assertion = "Acb_NtkHasObjFuncs(p)";
        goto LAB_003a4df7;
      }
      if (uVar4 <= uVar3) goto LAB_003a4da9;
      iVar10 = (p->vObjFunc).pArray[(int)uVar3];
      if (iVar10 < 0) {
        __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0x382,"void Acb_NtkRemapIntoSatVariables(Acb_Ntk_t *, Vec_Int_t *)");
      }
      begin[lVar15] = iVar10;
      lVar15 = lVar15 + 1;
      iVar10 = vSupp->nSize;
    } while (lVar15 < iVar10);
    if (iVar10 < 1) goto LAB_003a4ca3;
    lVar16 = 0;
    do {
      iVar10 = begin[lVar16] + nVars * 2;
      if (iVar10 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      begin[lVar16] = iVar10 * 2;
      lVar16 = lVar16 + 1;
      lVar15 = (long)vSupp->nSize;
    } while (lVar16 < lVar15);
  }
  iVar10 = sat_solver_solve(pSat,begin,begin + lVar15,0,0,0,0);
  if (iVar10 != -1) {
    printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
    __assert_fail("status == l_False",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x39e,
                  "int Acb_NtkFindSupp1(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar10 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
  if (vSupp->nSize < iVar10) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vSupp->nSize = iVar10;
  if (0 < iVar10) {
    piVar6 = vSupp->pArray;
    lVar15 = 0;
    do {
      uVar3 = piVar6[lVar15];
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      piVar6[lVar15] = (uVar3 >> 1) + nVars * -2;
      lVar15 = lVar15 + 1;
      iVar10 = vSupp->nSize;
    } while (lVar15 < iVar10);
  }
  if (Pivot < (p->vObjFans).nSize) {
    iVar2 = (p->vObjFans).pArray[(uint)Pivot];
    if ((-1 < (long)iVar2) && (iVar2 < (p->vFanSto).nSize)) {
      return (int)(iVar10 < (p->vFanSto).pArray[iVar2]);
    }
LAB_003a4e2e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_003a4da9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Acb_NtkFindSupp1( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp )
{
    int nSuppNew, status, k, iFanin, * pFanins;
    Vec_IntClear( vSupp );
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        Vec_IntPush( vSupp, iFanin );
    Acb_NtkOrderByRefCount( p, vSupp );
    Acb_NtkRemapIntoSatVariables( p, vSupp );
    Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
    status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
    if ( status != l_False )
        printf( "Failed internal check at node %d.\n", Pivot );
    assert( status == l_False );
    nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
    Vec_IntShrink( vSupp, nSuppNew );
    Vec_IntLits2Vars( vSupp, -2*nVars );
    return Vec_IntSize(vSupp) < Acb_ObjFaninNum(p, Pivot);
}